

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

lyplg_ext_sprinter_tree_node_override *
tro_set_node_overr(ly_bool lysc_tree,void *node,ly_bool erase_node_overr,trt_plugin_ctx *plc)

{
  lyspr_tree_ctx *plVar1;
  long *plVar2;
  void *pvVar3;
  lysp_ext_instance *pe;
  lysc_ext_instance *ce;
  lyspr_tree_ctx *plug_ctx;
  lyplg_ext_sprinter_tree_node_override *no;
  LY_ERR rc;
  trt_plugin_ctx *plc_local;
  ly_bool erase_node_overr_local;
  void *node_local;
  ly_bool lysc_tree_local;
  
  no._4_4_ = LY_SUCCESS;
  if (erase_node_overr != '\0') {
    trp_ext_free_node_override(&plc->node_overr,&plc->filtered);
  }
  plug_ctx = (lyspr_tree_ctx *)&plc->node_overr;
  if (((plc->ctx == (lyspr_tree_ctx *)0x0) && (lysc_tree != '\0')) &&
     (plVar2 = (long *)trp_ext_is_present(lysc_tree,node), plVar2 != (long *)0x0)) {
    no._4_4_ = (**(code **)(*(long *)(*plVar2 + 0x18) + 0x20))
                         (plVar2,0,plug_ctx,&(plc->node_overr).add_opts);
  }
  else if ((plc->ctx == (lyspr_tree_ctx *)0x0) &&
          (pvVar3 = trp_ext_is_present(lysc_tree,node), pvVar3 != (void *)0x0)) {
    no._4_4_ = (**(code **)(*(long *)((long)pvVar3 + 0x48) + 0x40))
                         (pvVar3,0,plug_ctx,&(plc->node_overr).add_opts);
  }
  else if (plc->ctx == (lyspr_tree_ctx *)0x0) {
    plug_ctx = (lyspr_tree_ctx *)0x0;
  }
  else {
    if (((plc->schema == (lyspr_tree_schema *)0x0) || (plc->schema->compiled == '\0')) ||
       ((plc->schema->field_2).cn_overr == (lyplg_ext_sprinter_ctree_override_clb)0x0)) {
      if ((plc->schema == (lyspr_tree_schema *)0x0) ||
         ((plc->schema->field_2).cn_overr == (lyplg_ext_sprinter_ctree_override_clb)0x0)) {
        plug_ctx = (lyspr_tree_ctx *)0x0;
      }
      else {
        no._4_4_ = (*(plc->schema->field_2).cn_overr)
                             ((lysc_node *)node,plc->ctx->plugin_priv,&plc->filtered,
                              (char **)plug_ctx,&(plc->node_overr).add_opts);
      }
    }
    else {
      no._4_4_ = (*(plc->schema->field_2).cn_overr)
                           ((lysc_node *)node,plc->ctx->plugin_priv,&plc->filtered,(char **)plug_ctx
                            ,&(plc->node_overr).add_opts);
    }
    pvVar3 = trp_ext_is_present(lysc_tree,node);
    if (pvVar3 != (void *)0x0) {
      plVar1 = plc->ctx;
      plc->ctx = (lyspr_tree_ctx *)0x0;
      tro_set_node_overr(lysc_tree,node,'\0',plc);
      plc->ctx = plVar1;
    }
  }
  if (no._4_4_ != LY_SUCCESS) {
    plc->last_error = (ly_bool)no._4_4_;
    plug_ctx = (lyspr_tree_ctx *)0x0;
  }
  return (lyplg_ext_sprinter_tree_node_override *)plug_ctx;
}

Assistant:

static struct lyplg_ext_sprinter_tree_node_override *
tro_set_node_overr(ly_bool lysc_tree, const void *node, ly_bool erase_node_overr, struct trt_plugin_ctx *plc)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyplg_ext_sprinter_tree_node_override *no;
    struct lyspr_tree_ctx *plug_ctx;
    struct lysc_ext_instance *ce;
    struct lysp_ext_instance *pe;

    if (erase_node_overr) {
        trp_ext_free_node_override(&plc->node_overr, &plc->filtered);
    }
    no = &plc->node_overr;
    if (!plc->ctx && lysc_tree && (ce = trp_ext_is_present(lysc_tree, node))) {
        rc = ce->def->plugin->printer_ctree(ce, NULL, &no->flags, &no->add_opts);
    } else if (!plc->ctx && (pe = trp_ext_is_present(lysc_tree, node))) {
        rc = pe->record->plugin.printer_ptree(pe, NULL, &no->flags, &no->add_opts);
    } else if (plc->ctx) {
        if (plc->schema && plc->schema->compiled && plc->schema->cn_overr) {
            rc = plc->schema->cn_overr(node, plc->ctx->plugin_priv, &plc->filtered, &no->flags, &no->add_opts);
        } else if (plc->schema && plc->schema->pn_overr) {
            rc = plc->schema->pn_overr(node, plc->ctx->plugin_priv, &plc->filtered, &no->flags, &no->add_opts);
        } else {
            no = NULL;
        }
        if (trp_ext_is_present(lysc_tree, node)) {
            plug_ctx = plc->ctx;
            plc->ctx = NULL;
            tro_set_node_overr(lysc_tree, node, 0, plc);
            plc->ctx = plug_ctx;
        }
    } else {
        no = NULL;
    }

    if (rc) {
        plc->last_error = rc;
        no = NULL;
    }

    return no;
}